

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O0

int ffp3di(fitsfile *fptr,long group,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,LONGLONG naxis2,
          LONGLONG naxis3,short *array,int *status)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int *in_stack_00000018;
  LONGLONG narray;
  LONGLONG nfits;
  long lpixel [3];
  long fpixel [3];
  long jj;
  long ii;
  long tablerow;
  void *in_stack_000002d0;
  int in_stack_000002dc;
  long *in_stack_000002e0;
  long *in_stack_000002e8;
  int in_stack_000002f4;
  fitsfile *in_stack_000002f8;
  void *in_stack_00000320;
  int *in_stack_00000328;
  short *in_stack_000071d0;
  LONGLONG in_stack_000071d8;
  LONGLONG in_stack_000071e0;
  LONGLONG in_stack_000071e8;
  int in_stack_000071f4;
  fitsfile *in_stack_000071f8;
  int *in_stack_00007240;
  fitsfile *in_stack_ffffffffffffff48;
  long local_50;
  long local_48;
  int local_4;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff48,(int *)0x22a898);
  if (iVar1 == 0) {
    if ((in_RDX == in_R8) && (in_RCX == in_R9)) {
      ffpcli(in_stack_000071f8,in_stack_000071f4,in_stack_000071e8,in_stack_000071e0,
             in_stack_000071d8,in_stack_000071d0,in_stack_00007240);
      local_4 = *in_stack_00000018;
    }
    else if ((in_RDX < in_R8) || (in_RCX < in_R9)) {
      *in_stack_00000018 = 0x140;
      local_4 = 0x140;
    }
    else {
      for (local_50 = 0; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
        for (local_48 = 0; local_48 < in_R9; local_48 = local_48 + 1) {
          iVar1 = ffpcli(in_stack_000071f8,in_stack_000071f4,in_stack_000071e8,in_stack_000071e0,
                         in_stack_000071d8,in_stack_000071d0,in_stack_00007240);
          if (0 < iVar1) {
            return *in_stack_00000018;
          }
        }
      }
      local_4 = *in_stack_00000018;
    }
  }
  else {
    fits_write_compressed_img
              (in_stack_000002f8,in_stack_000002f4,in_stack_000002e8,in_stack_000002e0,
               in_stack_000002dc,in_stack_000002d0,in_stack_00000320,in_stack_00000328);
    local_4 = *in_stack_00000018;
  }
  return local_4;
}

Assistant:

int ffp3di(fitsfile *fptr,   /* I - FITS file pointer                     */
           long  group,      /* I - group to write(1 = 1st group)         */
           LONGLONG  ncols,      /* I - number of pixels in each row of array */
           LONGLONG  nrows,      /* I - number of rows in each plane of array */
           LONGLONG  naxis1,     /* I - FITS image NAXIS1 value               */
           LONGLONG  naxis2,     /* I - FITS image NAXIS2 value               */
           LONGLONG  naxis3,     /* I - FITS image NAXIS3 value               */
           short *array,     /* I - array to be written                   */
           int  *status)     /* IO - error status                         */
/*
  Write an entire 3-D cube of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).
*/
{
    long tablerow, ii, jj;
    long fpixel[3]= {1,1,1}, lpixel[3];
    LONGLONG nfits, narray;
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
           
    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
        lpixel[0] = (long) ncols;
        lpixel[1] = (long) nrows;
        lpixel[2] = (long) naxis3;
       
        fits_write_compressed_img(fptr, TSHORT, fpixel, lpixel,
            0,  array, NULL, status);
    
        return(*status);
    }

    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
      /* all the image pixels are contiguous, so write all at once */
      ffpcli(fptr, 2, tablerow, 1L, naxis1 * naxis2 * naxis3, array, status);
      return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to write to */
    narray = 0;  /* next pixel in input array to be written */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* writing naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffpcli(fptr, 2, tablerow, nfits, naxis1,&array[narray],status) > 0)
         return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }
    return(*status);
}